

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O0

void rtosc::ring_write(ringbuffer_t *ring,char *data,size_t len)

{
  ulong uVar1;
  long lVar2;
  __int_type _Var3;
  __int_type _Var4;
  size_t __n;
  size_t in_RDX;
  void *in_RSI;
  long *in_RDI;
  size_t w2;
  size_t w1;
  long next_write;
  __atomic_base<long> *in_stack_ffffffffffffffb8;
  __atomic_base<long> *in_stack_ffffffffffffffc0;
  
  _Var3 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffffb8);
  uVar1 = in_RDI[4];
  _Var4 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffffb8);
  if ((long)((_Var3 + in_RDX) % uVar1) < _Var4) {
    in_stack_ffffffffffffffb8 = (__atomic_base<long> *)in_RDI[4];
    _Var3 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffffb8);
    __n = (long)in_stack_ffffffffffffffb8 - _Var3;
    in_stack_ffffffffffffffc0 = (__atomic_base<long> *)*in_RDI;
    _Var3 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffffb8);
    memcpy((void *)((long)&in_stack_ffffffffffffffc0->_M_i + _Var3),in_RSI,__n);
    memcpy((void *)*in_RDI,(void *)((long)in_RSI + __n),in_RDX - __n);
  }
  else {
    lVar2 = *in_RDI;
    _Var3 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffffb8);
    memcpy((void *)(lVar2 + _Var3),in_RSI,in_RDX);
  }
  std::__atomic_base<long>::operator=
            (in_stack_ffffffffffffffc0,(__int_type)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

static void ring_write(ringbuffer_t *ring, const char *data, size_t len)
{
    assert(ring_write_size(ring) >= len);
    const off_t  next_write = (ring->write + len)%ring->size;

    //discontinuous write
    if(next_write < ring->write) {
        const size_t w1 = ring->size - ring->write;
        const size_t w2 = len - w1;
        memcpy(ring->buffer+ring->write, data,    w1);
        memcpy(ring->buffer,             data+w1, w2);
    } else { //contiguous
        memcpy(ring->buffer+ring->write, data, len);
    }
    ring->write = next_write;
}